

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O1

void __thiscall Assimp::MDL::IntSharedData_MDL7::~IntSharedData_MDL7(IntSharedData_MDL7 *this)

{
  IntBone_MDL7 *pIVar1;
  pointer paVar2;
  pointer paVar3;
  aiVertexWeight *paVar4;
  pointer ppaVar5;
  ulong uVar6;
  
  if (this->apcOutBones != (IntBone_MDL7 **)0x0) {
    if (this->iNum != 0) {
      uVar6 = 0;
      do {
        pIVar1 = this->apcOutBones[uVar6];
        if (pIVar1 != (IntBone_MDL7 *)0x0) {
          paVar2 = (pIVar1->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (paVar2 != (pointer)0x0) {
            operator_delete(paVar2,(long)(pIVar1->pkeyRotations).
                                         super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)paVar2);
          }
          paVar3 = (pIVar1->pkeyScalings).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (paVar3 != (pointer)0x0) {
            operator_delete(paVar3,(long)(pIVar1->pkeyScalings).
                                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)paVar3);
          }
          paVar3 = (pIVar1->pkeyPositions).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (paVar3 != (pointer)0x0) {
            operator_delete(paVar3,(long)(pIVar1->pkeyPositions).
                                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)paVar3);
          }
          paVar4 = (pIVar1->super_aiBone).mWeights;
          if (paVar4 != (aiVertexWeight *)0x0) {
            operator_delete__(paVar4);
          }
          operator_delete(pIVar1,0x4c0);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->iNum);
    }
    if (this->apcOutBones != (IntBone_MDL7 **)0x0) {
      operator_delete__(this->apcOutBones);
    }
  }
  ppaVar5 = (this->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar5 != (pointer)0x0) {
    operator_delete(ppaVar5,(long)(this->pcMats).
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar5)
    ;
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)this);
  return;
}

Assistant:

~IntSharedData_MDL7()
    {
        // kill all bones
        if (this->apcOutBones)
        {
            for (unsigned int m = 0; m < iNum;++m)
                delete this->apcOutBones[m];
            delete[] this->apcOutBones;
        }
    }